

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# line_ransac.cpp
# Opt level: O2

void __thiscall LineModel::printLineParam(LineModel *this)

{
  ostream *poVar1;
  
  std::operator<<((ostream *)&std::cout,"best_model.A =  ");
  poVar1 = std::ostream::_M_insert<double>(this->A_);
  poVar1 = std::endl<char,std::char_traits<char>>(poVar1);
  std::operator<<(poVar1,"  best_model.B =  ");
  poVar1 = std::ostream::_M_insert<double>(this->B_);
  poVar1 = std::endl<char,std::char_traits<char>>(poVar1);
  std::operator<<(poVar1," best_model.C=  ");
  poVar1 = std::ostream::_M_insert<double>(this->C_);
  std::endl<char,std::char_traits<char>>(poVar1);
  return;
}

Assistant:

void printLineParam()
	{
		cout << "best_model.A =  "<< A_<< endl
			<<"  best_model.B =  " <<B_ <<endl
			<< " best_model.C=  "<<C_<< endl;
	}